

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLCheck.cpp
# Opt level: O1

void sf::priv::glCheckError(char *file,uint line,char *expression)

{
  int iVar1;
  ostream *poVar2;
  size_t sVar3;
  char *__s;
  undefined4 in_register_00000034;
  size_type __len2;
  string error;
  string description;
  string fileString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  iVar1 = glGetError(file,CONCAT44(in_register_00000034,line));
  if (iVar1 == 0) {
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,file,(allocator<char> *)&local_b0);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Unknown error","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"No description","");
  switch(iVar1) {
  case 0x500:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,local_b0._M_string_length,"GL_INVALID_ENUM",0xf);
    __len2 = 0x44;
    __s = "An unacceptable value has been specified for an enumerated argument.";
    break;
  case 0x501:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,local_b0._M_string_length,"GL_INVALID_VALUE",0x10);
    __len2 = 0x23;
    __s = "A numeric argument is out of range.";
    break;
  case 0x502:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,local_b0._M_string_length,"GL_INVALID_OPERATION",0x14);
    __len2 = 0x3c;
    __s = "The specified operation is not allowed in the current state.";
    break;
  case 0x503:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,local_b0._M_string_length,"GL_STACK_OVERFLOW",0x11);
    __len2 = 0x2a;
    __s = "This command would cause a stack overflow.";
    break;
  case 0x504:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,local_b0._M_string_length,"GL_STACK_UNDERFLOW",0x12);
    __len2 = 0x2b;
    __s = "This command would cause a stack underflow.";
    break;
  case 0x505:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,local_b0._M_string_length,"GL_OUT_OF_MEMORY",0x10);
    __len2 = 0x37;
    __s = "There is not enough memory left to execute the command.";
    break;
  case 0x506:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&local_b0,0,local_b0._M_string_length,"GL_INVALID_FRAMEBUFFER_OPERATION",0x20);
    __len2 = 0x46;
    __s = "The object bound to FRAMEBUFFER_BINDING is not \"framebuffer complete\".";
    break;
  default:
    goto switchD_00145395_default;
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_90,0,local_90._M_string_length,__s,__len2);
switchD_00145395_default:
  poVar2 = err();
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"An internal OpenGL call failed in ",0x22);
  std::__cxx11::string::find_last_of((char *)local_50,0x1e1cd5,0xffffffffffffffff);
  std::__cxx11::string::substr((ulong)&local_70,(ulong)local_50);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)local_70,local_68);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"(",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,").",2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nExpression:\n   ",0x10);
  if (expression == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(expression);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,expression,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\nError description:\n   ",0x17);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n   ",4);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (local_70 != local_60) {
    operator_delete(local_70,local_60[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

void glCheckError(const char* file, unsigned int line, const char* expression)
{
    // Get the last error
    GLenum errorCode = glGetError();

    if (errorCode != GL_NO_ERROR)
    {
        std::string fileString = file;
        std::string error = "Unknown error";
        std::string description  = "No description";

        // Decode the error code
        switch (errorCode)
        {
            case GL_INVALID_ENUM:
            {
                error = "GL_INVALID_ENUM";
                description = "An unacceptable value has been specified for an enumerated argument.";
                break;
            }

            case GL_INVALID_VALUE:
            {
                error = "GL_INVALID_VALUE";
                description = "A numeric argument is out of range.";
                break;
            }

            case GL_INVALID_OPERATION:
            {
                error = "GL_INVALID_OPERATION";
                description = "The specified operation is not allowed in the current state.";
                break;
            }

            case GL_STACK_OVERFLOW:
            {
                error = "GL_STACK_OVERFLOW";
                description = "This command would cause a stack overflow.";
                break;
            }

            case GL_STACK_UNDERFLOW:
            {
                error = "GL_STACK_UNDERFLOW";
                description = "This command would cause a stack underflow.";
                break;
            }

            case GL_OUT_OF_MEMORY:
            {
                error = "GL_OUT_OF_MEMORY";
                description = "There is not enough memory left to execute the command.";
                break;
            }

            case GLEXT_GL_INVALID_FRAMEBUFFER_OPERATION:
            {
                error = "GL_INVALID_FRAMEBUFFER_OPERATION";
                description = "The object bound to FRAMEBUFFER_BINDING is not \"framebuffer complete\".";
                break;
            }
        }

        // Log the error
        err() << "An internal OpenGL call failed in "
              << fileString.substr(fileString.find_last_of("\\/") + 1) << "(" << line << ")."
              << "\nExpression:\n   " << expression
              << "\nError description:\n   " << error << "\n   " << description << "\n"
              << std::endl;
    }
}